

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

void __thiscall PieceSquareTableBase::InvertColor(PieceSquareTableBase *this)

{
  uint i;
  long lVar1;
  PieceSquareRawTableType *pPVar2;
  long lVar3;
  PieceSquareRawTableType *__src;
  undefined1 *__dest;
  PieceSquareRawTableType temp;
  undefined1 local_110 [256];
  
  __src = &this->m_SourceTable;
  __dest = local_110;
  memcpy(__dest,__src,0x100);
  lVar1 = 0;
  do {
    lVar3 = 0x100;
    pPVar2 = __src;
    do {
      pPVar2->_M_elems[0] = *(int *)(__dest + lVar3 + -0x20);
      pPVar2 = (PieceSquareRawTableType *)(pPVar2->_M_elems + 8);
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != 0);
    lVar1 = lVar1 + 1;
    __dest = __dest + 4;
    __src = (PieceSquareRawTableType *)(__src->_M_elems + 1);
  } while (lVar1 != 8);
  return;
}

Assistant:

virtual void InvertColor()
    {
        PieceSquareRawTableType temp;
        temp = m_SourceTable;
        for ( unsigned int i = 0; i < MAX_FILES; i++ )
            for ( unsigned int j = 0; j < MAX_FILES; j++ )
            {
                m_SourceTable[ i + j * MAX_FILES ] =
                    temp[ i + ( ( MAX_FILES - 1 ) - j ) * MAX_FILES];
            }
    }